

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O1

void cutworm(monst *worm,xchar x,xchar y,obj *weap)

{
  byte bVar1;
  wseg *tail;
  uint uVar2;
  uint uVar3;
  monst *worm_00;
  char *pcVar4;
  uint uVar5;
  byte bVar6;
  int tmp;
  char *line;
  int iVar7;
  long lVar8;
  wseg *pwVar9;
  
  bVar1 = worm->wormno;
  if ((bVar1 != 0) && ((worm->mx != x || (worm->my != y)))) {
    uVar2 = mt_random();
    uVar5 = uVar2 % 0x14 + 1;
    if ((weap != (obj *)0x0) &&
       ((weap->oclass == '\x02' && ((byte)(objects[weap->otyp].oc_subtyp - 1U) < 10)))) {
      uVar5 = uVar2 % 0x14 + 0xb;
    }
    if (0x10 < uVar5) {
      tail = level->wtails[bVar1];
      pwVar9 = tail;
      while ((pwVar9->wx != x || (pwVar9->wy != y))) {
        pwVar9 = pwVar9->nseg;
        if (pwVar9 == (wseg *)0x0) {
          warning("cutworm: no segment at (%d,%d)",(ulong)(uint)(int)x,(ulong)(uint)(int)y);
          return;
        }
      }
      if (pwVar9 == tail) {
        shrink_worm((uint)bVar1);
        return;
      }
      level->wtails[bVar1] = pwVar9->nseg;
      pwVar9->nseg = (wseg *)0x0;
      uVar5 = mt_random();
      if (uVar5 * -0x55555555 < 0x55555556) {
        lVar8 = 0x1fdd;
        do {
          if (*(long *)(level->levname + lVar8 * 8) == 0) {
            iVar7 = (int)lVar8 + -0x1fdc;
            goto LAB_0028a167;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x1ffc);
        iVar7 = 0;
LAB_0028a167:
        if (iVar7 != 0) {
          remove_monster(level,(int)x,(int)y);
          worm_00 = clone_mon(worm,x,y);
          if (worm_00 != (monst *)0x0) {
            worm_00->wormno = (uchar)iVar7;
            bVar1 = worm->m_lev;
            uVar5 = 3;
            if (3 < bVar1 - 2) {
              uVar5 = bVar1 - 2;
            }
            bVar6 = (byte)uVar5;
            if (bVar1 < 4) {
              bVar6 = bVar1;
            }
            worm->m_lev = bVar6;
            worm_00->m_lev = bVar6;
            uVar5 = (uint)bVar6;
            if (bVar6 != 0) {
              uVar2 = (uint)bVar6;
              do {
                uVar3 = mt_random();
                uVar5 = uVar5 + (uVar3 & 7);
                uVar2 = uVar2 - 1;
              } while (uVar2 != 0);
            }
            worm_00->mhp = uVar5;
            worm_00->mhpmax = uVar5;
            uVar2 = (uint)worm->m_lev;
            uVar5 = (uint)worm->m_lev;
            if (3 < uVar5) {
              do {
                uVar3 = mt_random();
                uVar2 = uVar2 + (uVar3 & 7);
                uVar5 = uVar5 - 1;
              } while (uVar5 != 0);
              worm->mhpmax = uVar2;
              if ((int)uVar2 < worm->mhp) {
                worm->mhp = uVar2;
              }
            }
            level->wtails[iVar7] = tail;
            level->wheads[iVar7] = pwVar9;
            level->wgrowtime[iVar7] = 0;
            place_wsegs(worm_00);
            if (flags.mon_moving == '\0') {
              pcVar4 = mon_nam(worm);
              line = "You cut %s in half.";
            }
            else {
              pcVar4 = Monnam(worm);
              line = "%s is cut in half.";
            }
            pline(line,pcVar4);
            return;
          }
        }
      }
      cutoff(worm,tail);
      return;
    }
  }
  return;
}

Assistant:

void cutworm(struct monst *worm, xchar x, xchar y, struct obj *weap)
{
    struct wseg  *curr, *new_tail;
    struct monst *new_worm;
    int wnum = worm->wormno;
    int cut_chance, new_wnum;

    if (!wnum) return;	/* no worm */

    if (x == worm->mx && y == worm->my) return;		/* hit on head */

    /* cutting goes best with a bladed weapon */
    cut_chance = rnd(20);	/* Normally  1-16 does not cut */
				/* Normally 17-20 does */

    if (weap && is_blade(weap))	/* With a blade 1- 6 does not cut */
	cut_chance += 10;	/*		7-20 does */

    if (cut_chance < 17) return;	/* not good enough */

    /* Find the segment that was attacked. */
    curr = level->wtails[wnum];

    while ( (curr->wx != x) || (curr->wy != y) ) {
	curr = curr->nseg;
	if (!curr) {
	    warning("cutworm: no segment at (%d,%d)", x, y);
	    return;
	}
    }

    /* If this is the tail segment, then the worm just loses it. */
    if (curr == level->wtails[wnum]) {
	shrink_worm(wnum);
	return;
    }

    /*
     *  Split the worm.  The tail for the new worm is the old worm's tail.
     *  The tail for the old worm is the segment that follows "curr",
     *  and "curr" becomes the dummy segment under the new head.
     */
    new_tail = level->wtails[wnum];
    level->wtails[wnum] = curr->nseg;
    curr->nseg = NULL;	/* split the worm */

    /*
     *  At this point, the old worm is correct.  Any new worm will have
     *  it's head at "curr" and its tail at "new_tail".
     */

    /* Sometimes the tail end dies. */
    if (rn2(3) || !(new_wnum = get_wormno(level))) {
	cutoff(worm, new_tail);
	return;
    }

    remove_monster(level, x, y);		/* clone_mon puts new head here */
    if (!(new_worm = clone_mon(worm, x, y))) {
	cutoff(worm, new_tail);
	return;
    }
    new_worm->wormno = new_wnum;	/* affix new worm number */

    /* Devalue the monster level of both halves of the worm. */
    worm->m_lev = ((unsigned)worm->m_lev <= 3) ?
		   (unsigned)worm->m_lev : max((unsigned)worm->m_lev - 2, 3);
    new_worm->m_lev = worm->m_lev;

    /* Calculate the mhp on the new_worm for the (lower) monster level. */
    new_worm->mhpmax = new_worm->mhp = dice((int)new_worm->m_lev, 8);

    /* Calculate the mhp on the old worm for the (lower) monster level. */
    if (worm->m_lev > 3) {
	worm->mhpmax = dice((int)worm->m_lev, 8);
	if (worm->mhpmax < worm->mhp) worm->mhp = worm->mhpmax;
    }

    level->wtails[new_wnum] = new_tail;	/* We've got all the info right now */
    level->wheads[new_wnum] = curr;	/* so we can do this faster than    */
    level->wgrowtime[new_wnum] = 0L;	/* trying to call initworm().       */

    /* Place the new monster at all the segment locations. */
    place_wsegs(new_worm);

    if (flags.mon_moving)
	pline("%s is cut in half.", Monnam(worm));
    else
	pline("You cut %s in half.", mon_nam(worm));
}